

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O3

void Mvc_CoverMakeEmpty(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pCube;
  
  pCube = (pCover->lCubes).pHead;
  while (pCube != (Mvc_Cube_t *)0x0) {
    pMVar1 = pCube->pNext;
    Mvc_CubeFree(pCover,pCube);
    pCube = pMVar1;
  }
  (pCover->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).pTail = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = 0;
  return;
}

Assistant:

void Mvc_CoverMakeEmpty( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube, * pCube2;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
        Mvc_CubeFree( pCover, pCube );
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead = NULL;
    pCover->lCubes.pTail = NULL;
}